

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O0

int __thiscall leveldb::Slice::compare(Slice *this,Slice *b)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int r;
  size_t min_len;
  size_t local_30;
  int local_1c;
  
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    local_30 = in_RDI[1];
  }
  else {
    local_30 = in_RSI[1];
  }
  local_1c = memcmp((void *)*in_RDI,(void *)*in_RSI,local_30);
  if (local_1c == 0) {
    if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
      local_1c = -1;
    }
    else if ((ulong)in_RSI[1] < (ulong)in_RDI[1]) {
      local_1c = 1;
    }
  }
  return local_1c;
}

Assistant:

inline int Slice::compare(const Slice& b) const {
  const size_t min_len = (size_ < b.size_) ? size_ : b.size_;
  int r = memcmp(data_, b.data_, min_len);
  if (r == 0) {
    if (size_ < b.size_)
      r = -1;
    else if (size_ > b.size_)
      r = +1;
  }
  return r;
}